

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlParser.cpp
# Opt level: O0

void __thiscall KDReports::Test::testTabs(Test *this)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  const_reference pTVar4;
  qreal qVar5;
  QTextBlockFormat local_1d8 [16];
  double local_1c8;
  QTextBlockFormat local_1c0 [16];
  qreal local_1b0;
  QTextBlockFormat local_1a8 [16];
  QList<QTextOption::Tab> local_198;
  QTextBlock block3;
  double local_170;
  QTextBlockFormat local_168 [16];
  qreal local_158;
  QTextBlockFormat local_150 [20];
  TabType local_13c [3];
  qsizetype local_130;
  QTextBlockFormat local_128 [16];
  undefined1 local_118 [8];
  QList<QTextOption::Tab> tabs2;
  QTextBlock block2;
  TabType local_ec [3];
  qsizetype local_e0;
  QTextBlockFormat local_d8 [16];
  undefined1 local_c8 [8];
  QList<QTextOption::Tab> tabs1;
  QTextBlock block1;
  QString local_a0;
  QString local_88;
  undefined8 local_70;
  QTextDocument *doc;
  Report report;
  QFlags<QIODeviceBase::OpenModeFlag> local_48 [4];
  QString local_38;
  QFile local_20 [8];
  QFile file;
  Test *this_local;
  
  QString::QString(&local_38,":/tabs.xml");
  QFile::QFile(local_20,(QString *)&local_38);
  QString::~QString(&local_38);
  QFlags<QIODeviceBase::OpenModeFlag>::QFlags(local_48,ReadOnly);
  bVar1 = QFile::open((QFlags_conflict *)local_20);
  bVar1 = QTest::qVerify((bool)(bVar1 & 1),"file.open(QIODevice::ReadOnly)","",
                         "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                         ,0xa5);
  if ((bVar1 & 1) != 0) {
    KDReports::Report::Report((Report *)&doc,(QObject *)0x0);
    bVar1 = KDReports::Report::loadFromXML((QIODevice *)&doc,(ErrorDetails *)local_20);
    bVar1 = QTest::qVerify((bool)(bVar1 & 1),"report.loadFromXML(&file)","",
                           "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                           ,0xa7);
    if ((bVar1 & 1) != 0) {
      local_70 = KDReports::Report::mainTextDocument();
      iVar3 = QTextDocument::blockCount();
      bVar1 = QTest::qCompare(iVar3,3,"doc.blockCount()","3",
                              "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                              ,0xa9);
      if ((bVar1 & 1) != 0) {
        QTextDocument::toPlainText();
        QString::QString(&local_a0,"Left\tmiddle\tright\n0\t100\t200\nOnly a right margin");
        bVar2 = QTest::qCompare(&local_88,&local_a0,"doc.toPlainText()",
                                "QString(\"Left\\tmiddle\\tright\\n0\\t100\\t200\\nOnly a right margin\")"
                                ,
                                "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                ,0xaa);
        QString::~QString(&local_a0);
        QString::~QString(&local_88);
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          QTextDocument::firstBlock();
          QTextBlock::blockFormat();
          QTextBlockFormat::tabPositions();
          QTextBlockFormat::~QTextBlockFormat(local_d8);
          local_e0 = QList<QTextOption::Tab>::count((QList<QTextOption::Tab> *)local_c8);
          local_ec[2] = 2;
          bVar2 = QTest::qCompare<long_long,int>
                            (&local_e0,(qint32 *)(local_ec + 2),"tabs1.count()","2",
                             "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                             ,0xad);
          if (((bVar2 ^ 0xffU) & 1) == 0) {
            pTVar4 = QList<QTextOption::Tab>::operator[]((QList<QTextOption::Tab> *)local_c8,0);
            local_ec[1] = 2;
            bVar2 = QTest::qCompare<QTextOption::TabType,QTextOption::TabType>
                              ((TabType *)(pTVar4 + 8),local_ec + 1,"tabs1[0].type",
                               "QTextOption::CenterTab",
                               "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                               ,0xae);
            if (((bVar2 ^ 0xffU) & 1) == 0) {
              pTVar4 = QList<QTextOption::Tab>::operator[]((QList<QTextOption::Tab> *)local_c8,1);
              local_ec[0] = RightTab;
              bVar2 = QTest::qCompare<QTextOption::TabType,QTextOption::TabType>
                                ((TabType *)(pTVar4 + 8),local_ec,"tabs1[1].type",
                                 "QTextOption::RightTab",
                                 "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                 ,0xaf);
              if (((bVar2 ^ 0xffU) & 1) == 0) {
                QTextBlock::next();
                QTextBlock::blockFormat();
                QTextBlockFormat::tabPositions();
                QTextBlockFormat::~QTextBlockFormat(local_128);
                local_130 = QList<QTextOption::Tab>::count((QList<QTextOption::Tab> *)local_118);
                local_13c[2] = 2;
                bVar2 = QTest::qCompare<long_long,int>
                                  (&local_130,(qint32 *)(local_13c + 2),"tabs2.count()","2",
                                   "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                   ,0xb2);
                if (((bVar2 ^ 0xffU) & 1) == 0) {
                  pTVar4 = QList<QTextOption::Tab>::operator[]
                                     ((QList<QTextOption::Tab> *)local_118,0);
                  local_13c[1] = 0;
                  bVar2 = QTest::qCompare<QTextOption::TabType,QTextOption::TabType>
                                    ((TabType *)(pTVar4 + 8),local_13c + 1,"tabs2[0].type",
                                     "QTextOption::LeftTab",
                                     "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                     ,0xb3);
                  if (((bVar2 ^ 0xffU) & 1) == 0) {
                    pTVar4 = QList<QTextOption::Tab>::operator[]
                                       ((QList<QTextOption::Tab> *)local_118,1);
                    local_13c[0] = LeftTab;
                    bVar2 = QTest::qCompare<QTextOption::TabType,QTextOption::TabType>
                                      ((TabType *)(pTVar4 + 8),local_13c,"tabs2[1].type",
                                       "QTextOption::LeftTab",
                                       "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                       ,0xb4);
                    if (((bVar2 ^ 0xffU) & 1) == 0) {
                      QTextBlock::blockFormat();
                      qVar5 = QTextBlockFormat::leftMargin(local_150);
                      bVar1 = QTest::qVerify(100.0 < qVar5,"block2.blockFormat().leftMargin() > 100"
                                             ,"",
                                             "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                             ,0xb5);
                      QTextBlockFormat::~QTextBlockFormat(local_150);
                      if (((bVar1 ^ 0xff) & 1) == 0) {
                        QTextBlock::blockFormat();
                        local_158 = QTextBlockFormat::rightMargin(local_168);
                        local_170 = 0.0;
                        bVar1 = QTest::qCompare(&local_158,&local_170,
                                                "block2.blockFormat().rightMargin()","qreal(0)",
                                                "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                                ,0xb6);
                        QTextBlockFormat::~QTextBlockFormat(local_168);
                        if (((bVar1 ^ 0xff) & 1) == 0) {
                          QTextBlock::next();
                          QTextBlock::blockFormat();
                          QTextBlockFormat::tabPositions();
                          bVar2 = QTest::qCompare<QTextOption::Tab>
                                            (&local_198,(QList<QTextOption::Tab> *)local_118,
                                             "block3.blockFormat().tabPositions()","tabs2",
                                             "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                             ,0xb8);
                          QList<QTextOption::Tab>::~QList(&local_198);
                          QTextBlockFormat::~QTextBlockFormat(local_1a8);
                          if (((bVar2 ^ 0xffU) & 1) == 0) {
                            QTextBlock::blockFormat();
                            local_1b0 = QTextBlockFormat::leftMargin(local_1c0);
                            local_1c8 = 0.0;
                            bVar1 = QTest::qCompare(&local_1b0,&local_1c8,
                                                    "block3.blockFormat().leftMargin()","qreal(0)",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                                  ,0xb9);
                            QTextBlockFormat::~QTextBlockFormat(local_1c0);
                            if (((bVar1 ^ 0xff) & 1) == 0) {
                              QTextBlock::blockFormat();
                              qVar5 = QTextBlockFormat::rightMargin(local_1d8);
                              QTest::qVerify(100.0 < qVar5,
                                             "block3.blockFormat().rightMargin() > 100","",
                                             "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                             ,0xba);
                              QTextBlockFormat::~QTextBlockFormat(local_1d8);
                            }
                          }
                        }
                      }
                    }
                  }
                }
                QList<QTextOption::Tab>::~QList((QList<QTextOption::Tab> *)local_118);
              }
            }
          }
          QList<QTextOption::Tab>::~QList((QList<QTextOption::Tab> *)local_c8);
        }
      }
    }
    KDReports::Report::~Report((Report *)&doc);
  }
  QFile::~QFile(local_20);
  return;
}

Assistant:

void testTabs() // and paragraph margins
    {
        QFile file(":/tabs.xml");
        QVERIFY(file.open(QIODevice::ReadOnly));
        Report report;
        QVERIFY(report.loadFromXML(&file));
        QTextDocument &doc = *report.mainTextDocument();
        QCOMPARE(doc.blockCount(), 3);
        QCOMPARE(doc.toPlainText(), QString("Left\tmiddle\tright\n0\t100\t200\nOnly a right margin"));
        QTextBlock block1 = doc.firstBlock();
        const QList<QTextOption::Tab> tabs1 = block1.blockFormat().tabPositions();
        QCOMPARE(tabs1.count(), 2);
        QCOMPARE(tabs1[0].type, QTextOption::CenterTab);
        QCOMPARE(tabs1[1].type, QTextOption::RightTab);
        QTextBlock block2 = block1.next();
        const QList<QTextOption::Tab> tabs2 = block2.blockFormat().tabPositions();
        QCOMPARE(tabs2.count(), 2);
        QCOMPARE(tabs2[0].type, QTextOption::LeftTab);
        QCOMPARE(tabs2[1].type, QTextOption::LeftTab);
        QVERIFY(block2.blockFormat().leftMargin() > 100);
        QCOMPARE(block2.blockFormat().rightMargin(), qreal(0));
        QTextBlock block3 = block2.next();
        QCOMPARE(block3.blockFormat().tabPositions(), tabs2);
        QCOMPARE(block3.blockFormat().leftMargin(), qreal(0));
        QVERIFY(block3.blockFormat().rightMargin() > 100);
    }